

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfscursor.cpp
# Opt level: O2

void __thiscall QEglFSCursor::update(QEglFSCursor *this,QRect *rect,bool allScreens)

{
  CursorUpdateEvent *this_00;
  
  if (this[0xe8] != (QEglFSCursor)0x0) {
    return;
  }
  this[0xe8] = (QEglFSCursor)0x1;
  this_00 = (CursorUpdateEvent *)operator_new(0x30);
  CursorUpdateEvent::CursorUpdateEvent(this_00,(QPoint *)(this + 0x60),rect,allScreens);
  QCoreApplication::postEvent((QObject *)this,(QEvent *)this_00,0);
  return;
}

Assistant:

void QEglFSCursor::update(const QRect &rect, bool allScreens)
{
    if (!m_updateRequested) {
        // Must not flush the window system events directly from here since we are likely to
        // be a called directly from QGuiApplication's processMouseEvents. Flushing events
        // could cause reentering by dispatching more queued mouse events.
        m_updateRequested = true;
        QCoreApplication::postEvent(this, new CursorUpdateEvent(m_cursor.pos, rect, allScreens));
    }
}